

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffpkyl(fitsfile *fptr,char *keyname,int value,char *comm,int *status)

{
  int *in_R8;
  char card [81];
  char valstring [71];
  char *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff30;
  int *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  fitsfile *in_stack_ffffffffffffffa8;
  undefined4 local_4;
  
  if (*in_R8 < 1) {
    ffl2c(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(int *)0x2415f7);
    ffmkky((char *)card._72_8_,(char *)card._64_8_,(char *)card._56_8_,(char *)card._48_8_,
           (int *)card._40_8_);
    ffprec(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_4 = *in_R8;
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int ffpkyl( fitsfile *fptr,     /* I - FITS file pointer        */
            const char *keyname,/* I - name of keyword to write */
            int  value,         /* I - keyword value            */
            const char *comm,   /* I - keyword comment          */
            int  *status)       /* IO - error status            */
/*
  Write (put) the keyword, value and comment into the FITS header.
  Values equal to 0 will result in a False FITS keyword; any other
  non-zero value will result in a True FITS keyword.
*/
{
    char valstring[FLEN_VALUE];
    char card[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    ffl2c(value, valstring, status);   /* convert to formatted string */
    ffmkky(keyname, valstring, comm, card, status);  /* construct the keyword*/
    ffprec(fptr, card, status);  /* write the keyword*/

    return(*status);
}